

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger_impl.h
# Opt level: O0

void __thiscall
lwlog::
logger<lwlog::configuration<lwlog::disable_local_time,_lwlog::enable_thread_id,_lwlog::enable_process_id,_lwlog::enable_topics>,_lwlog::synchronous_policy,_lwlog::immediate_flush_policy,_lwlog::single_threaded_policy,_lwlog::sinks::stdout_sink>
::add_attribute(logger<lwlog::configuration<lwlog::disable_local_time,_lwlog::enable_thread_id,_lwlog::enable_process_id,_lwlog::enable_topics>,_lwlog::synchronous_policy,_lwlog::immediate_flush_policy,_lwlog::single_threaded_policy,_lwlog::sinks::stdout_sink>
                *this,string_view flag,attrib_value value)

{
  bool bVar1;
  __shared_ptr_access<lwlog::interface::sink,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *peVar2;
  undefined8 in_RCX;
  byte in_R8B;
  shared_ptr<lwlog::interface::sink> *sink;
  iterator __end0;
  iterator __begin0;
  vector<std::shared_ptr<lwlog::interface::sink>,_std::allocator<std::shared_ptr<lwlog::interface::sink>_>_>
  *__range2;
  logger<lwlog::configuration<lwlog::disable_local_time,_lwlog::enable_thread_id,_lwlog::enable_process_id,_lwlog::enable_topics>,_lwlog::synchronous_policy,_lwlog::immediate_flush_policy,_lwlog::single_threaded_policy,_lwlog::sinks::stdout_sink>
  *this_local;
  attrib_value value_local;
  string_view flag_local;
  
  __end0 = std::
           vector<std::shared_ptr<lwlog::interface::sink>,_std::allocator<std::shared_ptr<lwlog::interface::sink>_>_>
           ::begin(&(this->m_backend).sink_storage);
  sink = (shared_ptr<lwlog::interface::sink> *)
         std::
         vector<std::shared_ptr<lwlog::interface::sink>,_std::allocator<std::shared_ptr<lwlog::interface::sink>_>_>
         ::end(&(this->m_backend).sink_storage);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<std::shared_ptr<lwlog::interface::sink>_*,_std::vector<std::shared_ptr<lwlog::interface::sink>,_std::allocator<std::shared_ptr<lwlog::interface::sink>_>_>_>
                                *)&sink);
    if (!bVar1) break;
    this_00 = (__shared_ptr_access<lwlog::interface::sink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)__gnu_cxx::
                 __normal_iterator<std::shared_ptr<lwlog::interface::sink>_*,_std::vector<std::shared_ptr<lwlog::interface::sink>,_std::allocator<std::shared_ptr<lwlog::interface::sink>_>_>_>
                 ::operator*(&__end0);
    peVar2 = std::
             __shared_ptr_access<lwlog::interface::sink,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(this_00);
    (*peVar2->_vptr_sink[6])(peVar2,flag._M_len,flag._M_str,in_RCX,(ulong)in_R8B);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<lwlog::interface::sink>_*,_std::vector<std::shared_ptr<lwlog::interface::sink>,_std::allocator<std::shared_ptr<lwlog::interface::sink>_>_>_>
    ::operator++(&__end0);
  }
  return;
}

Assistant:

void logger<Config, LogExecutionPolicy, FlushPolicy, ThreadingPolicy, Sinks...>::add_attribute(
		std::string_view flag, details::attrib_value value)
	{
		for (const auto& sink : m_backend.sink_storage)
		{
			sink->add_attribute(flag, value);
		}
	}